

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::dht_tracker::delete_socket(dht_tracker *this,listen_socket_handle *s)

{
  dht_observer *pdVar1;
  int iVar2;
  undefined1 local_60 [32];
  address local_address;
  
  iVar2 = (**(this->m_log->super_dht_logger)._vptr_dht_logger)(this->m_log,0);
  if ((char)iVar2 != '\0') {
    aux::listen_socket_handle::get_local_endpoint((endpoint *)local_60,s);
    if (local_60._0_2_ != 2) {
      local_address.ipv6_address_.addr_.__in6_u._0_8_ = local_60._8_8_;
      local_address.ipv6_address_.addr_.__in6_u._8_8_ = local_60._16_8_;
      local_address.ipv6_address_.scope_id_ = (unsigned_long)(uint)local_60._24_4_;
      local_address.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_address.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_address.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_address.ipv6_address_.scope_id_ = 0;
      local_address.ipv4_address_.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_60._4_4_;
    }
    local_address.type_ = (anon_enum_32)(local_60._0_2_ != 2);
    pdVar1 = this->m_log;
    boost::asio::ip::address::to_string_abi_cxx11_((string *)local_60,&local_address);
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,0,"removing DHT node on %s",
               CONCAT44(local_60._4_4_,CONCAT22(local_60._2_2_,local_60._0_2_)));
    ::std::__cxx11::string::~string((string *)local_60);
  }
  ::std::
  _Rb_tree<libtorrent::aux::listen_socket_handle,_std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>,_std::_Select1st<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
  ::erase(&(this->m_nodes)._M_t,s);
  update_storage_node_ids(this);
  return;
}

Assistant:

void dht_tracker::delete_socket(aux::listen_socket_handle const& s)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (m_log->should_log(dht_logger::tracker))
		{
			address const local_address = s.get_local_endpoint().address();
			m_log->log(dht_logger::tracker, "removing DHT node on %s"
				, local_address.to_string().c_str());
		}
#endif
		m_nodes.erase(s);

		update_storage_node_ids();
	}